

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O1

void aom_highbd_lpf_horizontal_4_sse2
               (uint16_t *s,int p,uint8_t *_blimit,uint8_t *_limit,uint8_t *_thresh,int bd)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  long lVar40;
  short sVar41;
  undefined1 auVar42 [16];
  short sVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  short sVar50;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  short sVar51;
  undefined1 auVar49 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  ushort uVar57;
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  ushort uVar64;
  ushort uVar65;
  ushort uVar67;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  ushort uVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined4 uVar72;
  short sVar78;
  short sVar79;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  short sVar58;
  short sVar66;
  short sVar68;
  undefined8 uVar73;
  
  lVar40 = (long)p;
  auVar44 = *(undefined1 (*) [16])_blimit;
  auVar10[0xd] = 0;
  auVar10._0_13_ = auVar44._0_13_;
  auVar10[0xe] = auVar44[7];
  auVar13[0xc] = auVar44[6];
  auVar13._0_12_ = auVar44._0_12_;
  auVar13._13_2_ = auVar10._13_2_;
  auVar16[0xb] = 0;
  auVar16._0_11_ = auVar44._0_11_;
  auVar16._12_3_ = auVar13._12_3_;
  auVar19[10] = auVar44[5];
  auVar19._0_10_ = auVar44._0_10_;
  auVar19._11_4_ = auVar16._11_4_;
  auVar22[9] = 0;
  auVar22._0_9_ = auVar44._0_9_;
  auVar22._10_5_ = auVar19._10_5_;
  auVar25[8] = auVar44[4];
  auVar25._0_8_ = auVar44._0_8_;
  auVar25._9_6_ = auVar22._9_6_;
  auVar31._7_8_ = 0;
  auVar31._0_7_ = auVar25._8_7_;
  auVar34._1_8_ = SUB158(auVar31 << 0x40,7);
  auVar34[0] = auVar44[3];
  auVar34._9_6_ = 0;
  auVar35._1_10_ = SUB1510(auVar34 << 0x30,5);
  auVar35[0] = auVar44[2];
  auVar35._11_4_ = 0;
  auVar28[2] = auVar44[1];
  auVar28._0_2_ = auVar44._0_2_;
  auVar28._3_12_ = SUB1512(auVar35 << 0x20,3);
  auVar59._0_2_ = auVar44._0_2_ & 0xff;
  auVar59._2_13_ = auVar28._2_13_;
  auVar59[0xf] = 0;
  auVar42 = ZEXT416(bd - 8);
  auVar60 = psllw(auVar59,auVar42);
  auVar44 = *(undefined1 (*) [16])_limit;
  auVar11[0xd] = 0;
  auVar11._0_13_ = auVar44._0_13_;
  auVar11[0xe] = auVar44[7];
  auVar14[0xc] = auVar44[6];
  auVar14._0_12_ = auVar44._0_12_;
  auVar14._13_2_ = auVar11._13_2_;
  auVar17[0xb] = 0;
  auVar17._0_11_ = auVar44._0_11_;
  auVar17._12_3_ = auVar14._12_3_;
  auVar20[10] = auVar44[5];
  auVar20._0_10_ = auVar44._0_10_;
  auVar20._11_4_ = auVar17._11_4_;
  auVar23[9] = 0;
  auVar23._0_9_ = auVar44._0_9_;
  auVar23._10_5_ = auVar20._10_5_;
  auVar26[8] = auVar44[4];
  auVar26._0_8_ = auVar44._0_8_;
  auVar26._9_6_ = auVar23._9_6_;
  auVar32._7_8_ = 0;
  auVar32._0_7_ = auVar26._8_7_;
  auVar36._1_8_ = SUB158(auVar32 << 0x40,7);
  auVar36[0] = auVar44[3];
  auVar36._9_6_ = 0;
  auVar37._1_10_ = SUB1510(auVar36 << 0x30,5);
  auVar37[0] = auVar44[2];
  auVar37._11_4_ = 0;
  auVar29[2] = auVar44[1];
  auVar29._0_2_ = auVar44._0_2_;
  auVar29._3_12_ = SUB1512(auVar37 << 0x20,3);
  auVar80._0_2_ = auVar44._0_2_ & 0xff;
  auVar80._2_13_ = auVar29._2_13_;
  auVar80[0xf] = 0;
  auVar46 = psllw(auVar80,auVar42);
  auVar44 = *(undefined1 (*) [16])_thresh;
  auVar12[0xd] = 0;
  auVar12._0_13_ = auVar44._0_13_;
  auVar12[0xe] = auVar44[7];
  auVar15[0xc] = auVar44[6];
  auVar15._0_12_ = auVar44._0_12_;
  auVar15._13_2_ = auVar12._13_2_;
  auVar18[0xb] = 0;
  auVar18._0_11_ = auVar44._0_11_;
  auVar18._12_3_ = auVar15._12_3_;
  auVar21[10] = auVar44[5];
  auVar21._0_10_ = auVar44._0_10_;
  auVar21._11_4_ = auVar18._11_4_;
  auVar24[9] = 0;
  auVar24._0_9_ = auVar44._0_9_;
  auVar24._10_5_ = auVar21._10_5_;
  auVar27[8] = auVar44[4];
  auVar27._0_8_ = auVar44._0_8_;
  auVar27._9_6_ = auVar24._9_6_;
  auVar33._7_8_ = 0;
  auVar33._0_7_ = auVar27._8_7_;
  auVar38._1_8_ = SUB158(auVar33 << 0x40,7);
  auVar38[0] = auVar44[3];
  auVar38._9_6_ = 0;
  auVar39._1_10_ = SUB1510(auVar38 << 0x30,5);
  auVar39[0] = auVar44[2];
  auVar39._11_4_ = 0;
  auVar30[2] = auVar44[1];
  auVar30._0_2_ = auVar44._0_2_;
  auVar30._3_12_ = SUB1512(auVar39 << 0x20,3);
  auVar54._0_2_ = auVar44._0_2_ & 0xff;
  auVar54._2_13_ = auVar30._2_13_;
  auVar54[0xf] = 0;
  auVar55 = psllw(auVar54,auVar42);
  auVar44 = ZEXT416((uint)(1 << ((char)bd - 1U & 0x1f)));
  auVar44 = pshuflw(auVar44,auVar44,0);
  auVar45._0_4_ = auVar44._0_4_;
  auVar45._4_4_ = auVar45._0_4_;
  auVar45._8_4_ = auVar45._0_4_;
  auVar45._12_4_ = auVar45._0_4_;
  auVar74._8_8_ = *(undefined8 *)s;
  auVar74._0_8_ = *(undefined8 *)(s + -lVar40);
  uVar73 = *(undefined8 *)(s + lVar40);
  auVar44._8_8_ = *(undefined8 *)(s + -(long)(p * 2));
  auVar44._0_8_ = *(undefined8 *)(s + -lVar40);
  auVar70._8_8_ = uVar73;
  auVar70._0_8_ = *(undefined8 *)(s + -(long)(p * 2));
  auVar42._8_4_ = (int)uVar73;
  auVar42._0_8_ = *(undefined8 *)s;
  auVar42._12_4_ = (int)((ulong)uVar73 >> 0x20);
  auVar52 = psubusw(auVar44,auVar42);
  auVar80 = psubusw(auVar42,auVar44);
  auVar80 = auVar80 | auVar52;
  auVar52 = paddusw(auVar80,auVar80);
  auVar53._0_8_ = auVar52._0_8_;
  auVar53._8_8_ = 0;
  auVar81._0_2_ = auVar80._8_2_ >> 1;
  auVar81._2_2_ = auVar80._10_2_ >> 1;
  auVar81._4_2_ = auVar80._12_2_ >> 1;
  auVar81._6_2_ = auVar80._14_2_ >> 1;
  auVar81._8_8_ = 0;
  auVar52 = paddusw(auVar81,auVar53);
  auVar52 = auVar52 ^ _DAT_004d48a0;
  auVar60 = auVar60 ^ _DAT_004d48a0;
  auVar82._0_2_ = -(ushort)(auVar60._0_2_ < auVar52._0_2_);
  auVar82._2_2_ = -(ushort)(auVar60._2_2_ < auVar52._2_2_);
  auVar82._4_2_ = -(ushort)(auVar60._4_2_ < auVar52._4_2_);
  auVar82._6_2_ = -(ushort)(auVar60._6_2_ < auVar52._6_2_);
  auVar82._8_2_ = -(ushort)(auVar60._8_2_ < auVar52._8_2_);
  auVar82._10_2_ = -(ushort)(auVar60._10_2_ < auVar52._10_2_);
  auVar82._12_2_ = -(ushort)(auVar60._12_2_ < auVar52._12_2_);
  auVar82._14_2_ = -(ushort)(auVar60._14_2_ < auVar52._14_2_);
  auVar52 = paddusw(auVar46,_DAT_0050f220);
  auVar52 = auVar52 & auVar82;
  auVar80 = psubusw(auVar74,auVar70);
  auVar60 = psubusw(auVar70,auVar74);
  auVar60 = auVar60 | auVar80;
  sVar68 = auVar60._0_2_;
  sVar66 = auVar60._8_2_;
  auVar75._0_2_ = (ushort)(sVar66 < sVar68) * sVar68 | (ushort)(sVar66 >= sVar68) * sVar66;
  sVar79 = auVar60._2_2_;
  sVar68 = auVar60._10_2_;
  auVar75._2_2_ = (ushort)(sVar68 < sVar79) * sVar79 | (ushort)(sVar68 >= sVar79) * sVar68;
  sVar79 = auVar60._4_2_;
  sVar78 = auVar60._12_2_;
  auVar75._4_2_ = (ushort)(sVar78 < sVar79) * sVar79 | (ushort)(sVar78 >= sVar79) * sVar78;
  sVar58 = auVar60._6_2_;
  sVar79 = auVar60._14_2_;
  auVar75._6_2_ = (ushort)(sVar79 < sVar58) * sVar58 | (ushort)(sVar79 >= sVar58) * sVar79;
  sVar66 = (ushort)(0 < sVar66) * sVar66;
  auVar75._8_2_ = sVar66;
  sVar68 = (ushort)(0 < sVar68) * sVar68;
  auVar75._10_2_ = sVar68;
  sVar78 = (ushort)(0 < sVar78) * sVar78;
  auVar75._12_2_ = sVar78;
  sVar79 = (ushort)(0 < sVar79) * sVar79;
  auVar75._14_2_ = sVar79;
  sVar58 = auVar52._0_2_;
  uVar57 = (sVar58 < (short)auVar75._0_2_) * auVar75._0_2_ |
           (ushort)(sVar58 >= (short)auVar75._0_2_) * sVar58;
  sVar58 = auVar52._2_2_;
  uVar61 = (sVar58 < (short)auVar75._2_2_) * auVar75._2_2_ |
           (ushort)(sVar58 >= (short)auVar75._2_2_) * sVar58;
  sVar58 = auVar52._4_2_;
  uVar62 = (sVar58 < (short)auVar75._4_2_) * auVar75._4_2_ |
           (ushort)(sVar58 >= (short)auVar75._4_2_) * sVar58;
  sVar58 = auVar52._6_2_;
  uVar63 = (sVar58 < (short)auVar75._6_2_) * auVar75._6_2_ |
           (ushort)(sVar58 >= (short)auVar75._6_2_) * sVar58;
  sVar58 = auVar52._8_2_;
  uVar64 = (ushort)(sVar58 < sVar66) * sVar66 | (ushort)(sVar58 >= sVar66) * sVar58;
  sVar66 = auVar52._10_2_;
  uVar65 = (ushort)(sVar66 < sVar68) * sVar68 | (ushort)(sVar66 >= sVar68) * sVar66;
  sVar68 = auVar52._12_2_;
  sVar66 = auVar52._14_2_;
  uVar67 = (ushort)(sVar68 < sVar78) * sVar78 | (ushort)(sVar68 >= sVar78) * sVar68;
  uVar69 = (ushort)(sVar66 < sVar79) * sVar79 | (ushort)(sVar66 >= sVar79) * sVar66;
  auVar75 = auVar75 ^ _DAT_004d48a0;
  auVar55 = auVar55 ^ _DAT_004d48a0;
  uVar72 = CONCAT22(-(ushort)(auVar55._2_2_ < auVar75._2_2_),
                    -(ushort)(auVar55._0_2_ < auVar75._0_2_));
  uVar73 = CONCAT26(-(ushort)(auVar55._6_2_ < auVar75._6_2_),
                    CONCAT24(-(ushort)(auVar55._4_2_ < auVar75._4_2_),uVar72));
  auVar56._8_4_ = uVar72;
  auVar56._0_8_ = uVar73;
  auVar56._12_4_ = (int)((ulong)uVar73 >> 0x20);
  auVar76._0_2_ =
       ((short)uVar64 < (short)uVar57) * uVar57 | ((short)uVar64 >= (short)uVar57) * uVar64;
  auVar76._2_2_ =
       ((short)uVar65 < (short)uVar61) * uVar61 | ((short)uVar65 >= (short)uVar61) * uVar65;
  auVar76._4_2_ =
       ((short)uVar67 < (short)uVar62) * uVar62 | ((short)uVar67 >= (short)uVar62) * uVar67;
  auVar76._6_2_ =
       ((short)uVar69 < (short)uVar63) * uVar63 | ((short)uVar69 >= (short)uVar63) * uVar69;
  auVar76._8_2_ = (0 < (short)uVar64) * uVar64;
  auVar76._10_2_ = (0 < (short)uVar65) * uVar65;
  auVar76._12_2_ = (0 < (short)uVar67) * uVar67;
  auVar76._14_2_ = (0 < (short)uVar69) * uVar69;
  auVar52 = psllw(_DAT_0050f220,ZEXT416((uint)bd));
  auVar71._8_4_ = 0xffffffff;
  auVar71._0_8_ = 0xffffffffffffffff;
  auVar71._12_4_ = 0xffffffff;
  auVar52 = paddsw(auVar52,auVar71);
  auVar52 = psubsw(auVar52,auVar45);
  auVar55 = psubsw((undefined1  [16])0x0,auVar45);
  auVar44 = psubsw(auVar44,auVar45);
  auVar42 = psubsw(auVar42,auVar45);
  auVar60 = psubsw(auVar44,auVar42);
  sVar50 = auVar52._0_2_;
  sVar68 = auVar60._0_2_;
  uVar57 = (ushort)(sVar50 < sVar68) * sVar50 | (ushort)(sVar50 >= sVar68) * sVar68;
  sVar51 = auVar52._2_2_;
  sVar68 = auVar60._2_2_;
  uVar61 = (ushort)(sVar51 < sVar68) * sVar51 | (ushort)(sVar51 >= sVar68) * sVar68;
  sVar4 = auVar52._4_2_;
  sVar68 = auVar60._4_2_;
  uVar62 = (ushort)(sVar4 < sVar68) * sVar4 | (ushort)(sVar4 >= sVar68) * sVar68;
  sVar5 = auVar52._6_2_;
  sVar68 = auVar60._6_2_;
  uVar63 = (ushort)(sVar5 < sVar68) * sVar5 | (ushort)(sVar5 >= sVar68) * sVar68;
  sVar6 = auVar52._8_2_;
  sVar68 = auVar60._8_2_;
  uVar64 = (ushort)(sVar6 < sVar68) * sVar6 | (ushort)(sVar6 >= sVar68) * sVar68;
  sVar7 = auVar52._10_2_;
  sVar68 = auVar60._10_2_;
  uVar65 = (ushort)(sVar7 < sVar68) * sVar7 | (ushort)(sVar7 >= sVar68) * sVar68;
  sVar8 = auVar52._12_2_;
  sVar68 = auVar60._12_2_;
  sVar66 = auVar60._14_2_;
  uVar67 = (ushort)(sVar8 < sVar68) * sVar8 | (ushort)(sVar8 >= sVar68) * sVar68;
  sVar9 = auVar52._14_2_;
  uVar69 = (ushort)(sVar9 < sVar66) * sVar9 | (ushort)(sVar9 >= sVar66) * sVar66;
  sVar68 = auVar55._0_2_;
  auVar83._0_2_ = (ushort)((short)uVar57 < sVar68) * sVar68 | ((short)uVar57 >= sVar68) * uVar57;
  sVar66 = auVar55._2_2_;
  auVar83._2_2_ = (ushort)((short)uVar61 < sVar66) * sVar66 | ((short)uVar61 >= sVar66) * uVar61;
  sVar79 = auVar55._4_2_;
  auVar83._4_2_ = (ushort)((short)uVar62 < sVar79) * sVar79 | ((short)uVar62 >= sVar79) * uVar62;
  sVar78 = auVar55._6_2_;
  auVar83._6_2_ = (ushort)((short)uVar63 < sVar78) * sVar78 | ((short)uVar63 >= sVar78) * uVar63;
  sVar58 = auVar55._8_2_;
  auVar83._8_2_ = (ushort)((short)uVar64 < sVar58) * sVar58 | ((short)uVar64 >= sVar58) * uVar64;
  sVar1 = auVar55._10_2_;
  auVar83._10_2_ = (ushort)((short)uVar65 < sVar1) * sVar1 | ((short)uVar65 >= sVar1) * uVar65;
  sVar2 = auVar55._12_2_;
  auVar83._12_2_ = (ushort)((short)uVar67 < sVar2) * sVar2 | ((short)uVar67 >= sVar2) * uVar67;
  sVar3 = auVar55._14_2_;
  auVar83._14_2_ = (ushort)((short)uVar69 < sVar3) * sVar3 | ((short)uVar69 >= sVar3) * uVar69;
  auVar52 = psubsw(auVar83 >> 0x40 & auVar56,auVar83);
  auVar52 = psubsw(auVar52,auVar83);
  auVar52 = psubsw(auVar52,auVar83);
  sVar41 = auVar52._0_2_;
  uVar57 = (ushort)(sVar50 < sVar41) * sVar50 | (ushort)(sVar50 >= sVar41) * sVar41;
  sVar41 = auVar52._2_2_;
  uVar61 = (ushort)(sVar51 < sVar41) * sVar51 | (ushort)(sVar51 >= sVar41) * sVar41;
  sVar41 = auVar52._4_2_;
  uVar62 = (ushort)(sVar4 < sVar41) * sVar4 | (ushort)(sVar4 >= sVar41) * sVar41;
  sVar41 = auVar52._6_2_;
  uVar63 = (ushort)(sVar5 < sVar41) * sVar5 | (ushort)(sVar5 >= sVar41) * sVar41;
  sVar41 = auVar52._8_2_;
  uVar64 = (ushort)(sVar6 < sVar41) * sVar6 | (ushort)(sVar6 >= sVar41) * sVar41;
  sVar41 = auVar52._10_2_;
  uVar65 = (ushort)(sVar7 < sVar41) * sVar7 | (ushort)(sVar7 >= sVar41) * sVar41;
  sVar41 = auVar52._12_2_;
  sVar43 = auVar52._14_2_;
  uVar67 = (ushort)(sVar8 < sVar41) * sVar8 | (ushort)(sVar8 >= sVar41) * sVar41;
  uVar69 = (ushort)(sVar9 < sVar43) * sVar9 | (ushort)(sVar9 >= sVar43) * sVar43;
  auVar84._0_2_ = (ushort)((short)uVar57 < sVar68) * sVar68 | ((short)uVar57 >= sVar68) * uVar57;
  auVar84._2_2_ = (ushort)((short)uVar61 < sVar66) * sVar66 | ((short)uVar61 >= sVar66) * uVar61;
  auVar84._4_2_ = (ushort)((short)uVar62 < sVar79) * sVar79 | ((short)uVar62 >= sVar79) * uVar62;
  auVar84._6_2_ = (ushort)((short)uVar63 < sVar78) * sVar78 | ((short)uVar63 >= sVar78) * uVar63;
  auVar84._8_2_ = (ushort)((short)uVar64 < sVar58) * sVar58 | ((short)uVar64 >= sVar58) * uVar64;
  auVar84._10_2_ = (ushort)((short)uVar65 < sVar1) * sVar1 | ((short)uVar65 >= sVar1) * uVar65;
  auVar84._12_2_ = (ushort)((short)uVar67 < sVar2) * sVar2 | ((short)uVar67 >= sVar2) * uVar67;
  auVar84._14_2_ = (ushort)((short)uVar69 < sVar3) * sVar3 | ((short)uVar69 >= sVar3) * uVar69;
  auVar46 = psubusw(auVar76,auVar46);
  auVar77._0_2_ = -(ushort)(auVar46._0_2_ == 0);
  auVar77._2_2_ = -(ushort)(auVar46._2_2_ == 0);
  auVar77._4_2_ = -(ushort)(auVar46._4_2_ == 0);
  auVar77._6_2_ = -(ushort)(auVar46._6_2_ == 0);
  auVar77._8_2_ = -(ushort)(auVar46._8_2_ == 0);
  auVar77._10_2_ = -(ushort)(auVar46._10_2_ == 0);
  auVar77._12_2_ = -(ushort)(auVar46._12_2_ == 0);
  auVar77._14_2_ = -(ushort)(auVar46._14_2_ == 0);
  auVar77 = auVar77 & auVar84;
  auVar52._0_8_ = auVar77._0_8_;
  auVar52._8_4_ = auVar77._0_4_;
  auVar52._12_4_ = auVar77._4_4_;
  auVar46 = paddsw(auVar52,_DAT_0050f230);
  sVar41 = auVar46._0_2_;
  uVar57 = (ushort)(sVar50 < sVar41) * sVar50 | (ushort)(sVar50 >= sVar41) * sVar41;
  sVar41 = auVar46._2_2_;
  uVar61 = (ushort)(sVar51 < sVar41) * sVar51 | (ushort)(sVar51 >= sVar41) * sVar41;
  sVar41 = auVar46._4_2_;
  uVar62 = (ushort)(sVar4 < sVar41) * sVar4 | (ushort)(sVar4 >= sVar41) * sVar41;
  sVar41 = auVar46._6_2_;
  uVar63 = (ushort)(sVar5 < sVar41) * sVar5 | (ushort)(sVar5 >= sVar41) * sVar41;
  sVar41 = auVar46._8_2_;
  uVar64 = (ushort)(sVar6 < sVar41) * sVar6 | (ushort)(sVar6 >= sVar41) * sVar41;
  sVar41 = auVar46._10_2_;
  uVar65 = (ushort)(sVar7 < sVar41) * sVar7 | (ushort)(sVar7 >= sVar41) * sVar41;
  sVar41 = auVar46._12_2_;
  sVar43 = auVar46._14_2_;
  uVar67 = (ushort)(sVar8 < sVar41) * sVar8 | (ushort)(sVar8 >= sVar41) * sVar41;
  uVar69 = (ushort)(sVar9 < sVar43) * sVar9 | (ushort)(sVar9 >= sVar43) * sVar43;
  auVar55._0_2_ = (ushort)((short)uVar57 < sVar68) * sVar68 | ((short)uVar57 >= sVar68) * uVar57;
  auVar55._2_2_ = (ushort)((short)uVar61 < sVar66) * sVar66 | ((short)uVar61 >= sVar66) * uVar61;
  auVar55._4_2_ = (ushort)((short)uVar62 < sVar79) * sVar79 | ((short)uVar62 >= sVar79) * uVar62;
  auVar55._6_2_ = (ushort)((short)uVar63 < sVar78) * sVar78 | ((short)uVar63 >= sVar78) * uVar63;
  auVar55._8_2_ = (ushort)((short)uVar64 < sVar58) * sVar58 | ((short)uVar64 >= sVar58) * uVar64;
  auVar55._10_2_ = (ushort)((short)uVar65 < sVar1) * sVar1 | ((short)uVar65 >= sVar1) * uVar65;
  auVar55._12_2_ = (ushort)((short)uVar67 < sVar2) * sVar2 | ((short)uVar67 >= sVar2) * uVar67;
  auVar55._14_2_ = (ushort)((short)uVar69 < sVar3) * sVar3 | ((short)uVar69 >= sVar3) * uVar69;
  auVar46 = psraw(auVar55,3);
  auVar47._0_2_ = auVar46._0_2_ + 1;
  auVar47._2_2_ = auVar46._2_2_ + 1;
  auVar47._4_2_ = auVar46._4_2_ + 1;
  auVar47._6_2_ = auVar46._6_2_ + 1;
  auVar47._8_2_ = auVar46._0_2_ + 1;
  auVar47._10_2_ = auVar46._2_2_ + 1;
  auVar47._12_2_ = auVar46._4_2_ + 1;
  auVar47._14_2_ = auVar46._6_2_ + 1;
  auVar52 = psraw(auVar47,1);
  auVar48._8_8_ = SUB168(~auVar56 & auVar52,8);
  auVar48._0_8_ = auVar46._8_8_;
  auVar60._8_8_ = SUB168(~auVar56 & auVar52,0);
  auVar60._0_8_ = auVar46._0_8_;
  auVar42 = psubsw(auVar42,auVar60);
  auVar44 = paddsw(auVar48,auVar44);
  sVar41 = auVar42._0_2_;
  uVar57 = (ushort)(sVar50 < sVar41) * sVar50 | (ushort)(sVar50 >= sVar41) * sVar41;
  sVar41 = auVar42._2_2_;
  uVar61 = (ushort)(sVar51 < sVar41) * sVar51 | (ushort)(sVar51 >= sVar41) * sVar41;
  sVar41 = auVar42._4_2_;
  uVar62 = (ushort)(sVar4 < sVar41) * sVar4 | (ushort)(sVar4 >= sVar41) * sVar41;
  sVar41 = auVar42._6_2_;
  uVar63 = (ushort)(sVar5 < sVar41) * sVar5 | (ushort)(sVar5 >= sVar41) * sVar41;
  sVar41 = auVar42._8_2_;
  uVar64 = (ushort)(sVar6 < sVar41) * sVar6 | (ushort)(sVar6 >= sVar41) * sVar41;
  sVar41 = auVar42._10_2_;
  uVar65 = (ushort)(sVar7 < sVar41) * sVar7 | (ushort)(sVar7 >= sVar41) * sVar41;
  sVar41 = auVar42._12_2_;
  sVar43 = auVar42._14_2_;
  uVar67 = (ushort)(sVar8 < sVar41) * sVar8 | (ushort)(sVar8 >= sVar41) * sVar41;
  uVar69 = (ushort)(sVar9 < sVar43) * sVar9 | (ushort)(sVar9 >= sVar43) * sVar43;
  auVar46._0_2_ = (ushort)((short)uVar57 < sVar68) * sVar68 | ((short)uVar57 >= sVar68) * uVar57;
  auVar46._2_2_ = (ushort)((short)uVar61 < sVar66) * sVar66 | ((short)uVar61 >= sVar66) * uVar61;
  auVar46._4_2_ = (ushort)((short)uVar62 < sVar79) * sVar79 | ((short)uVar62 >= sVar79) * uVar62;
  auVar46._6_2_ = (ushort)((short)uVar63 < sVar78) * sVar78 | ((short)uVar63 >= sVar78) * uVar63;
  auVar46._8_2_ = (ushort)((short)uVar64 < sVar58) * sVar58 | ((short)uVar64 >= sVar58) * uVar64;
  auVar46._10_2_ = (ushort)((short)uVar65 < sVar1) * sVar1 | ((short)uVar65 >= sVar1) * uVar65;
  auVar46._12_2_ = (ushort)((short)uVar67 < sVar2) * sVar2 | ((short)uVar67 >= sVar2) * uVar67;
  auVar46._14_2_ = (ushort)((short)uVar69 < sVar3) * sVar3 | ((short)uVar69 >= sVar3) * uVar69;
  sVar41 = auVar44._0_2_;
  uVar57 = (ushort)(sVar50 < sVar41) * sVar50 | (ushort)(sVar50 >= sVar41) * sVar41;
  sVar50 = auVar44._2_2_;
  uVar61 = (ushort)(sVar51 < sVar50) * sVar51 | (ushort)(sVar51 >= sVar50) * sVar50;
  sVar50 = auVar44._4_2_;
  uVar62 = (ushort)(sVar4 < sVar50) * sVar4 | (ushort)(sVar4 >= sVar50) * sVar50;
  sVar50 = auVar44._6_2_;
  uVar63 = (ushort)(sVar5 < sVar50) * sVar5 | (ushort)(sVar5 >= sVar50) * sVar50;
  sVar50 = auVar44._8_2_;
  uVar64 = (ushort)(sVar6 < sVar50) * sVar6 | (ushort)(sVar6 >= sVar50) * sVar50;
  sVar50 = auVar44._10_2_;
  uVar65 = (ushort)(sVar7 < sVar50) * sVar7 | (ushort)(sVar7 >= sVar50) * sVar50;
  sVar50 = auVar44._12_2_;
  sVar51 = auVar44._14_2_;
  uVar67 = (ushort)(sVar8 < sVar50) * sVar8 | (ushort)(sVar8 >= sVar50) * sVar50;
  uVar69 = (ushort)(sVar9 < sVar51) * sVar9 | (ushort)(sVar9 >= sVar51) * sVar51;
  auVar49._0_2_ = (ushort)((short)uVar57 < sVar68) * sVar68 | ((short)uVar57 >= sVar68) * uVar57;
  auVar49._2_2_ = (ushort)((short)uVar61 < sVar66) * sVar66 | ((short)uVar61 >= sVar66) * uVar61;
  auVar49._4_2_ = (ushort)((short)uVar62 < sVar79) * sVar79 | ((short)uVar62 >= sVar79) * uVar62;
  auVar49._6_2_ = (ushort)((short)uVar63 < sVar78) * sVar78 | ((short)uVar63 >= sVar78) * uVar63;
  auVar49._8_2_ = (ushort)((short)uVar64 < sVar58) * sVar58 | ((short)uVar64 >= sVar58) * uVar64;
  auVar49._10_2_ = (ushort)((short)uVar65 < sVar1) * sVar1 | ((short)uVar65 >= sVar1) * uVar65;
  auVar49._12_2_ = (ushort)((short)uVar67 < sVar2) * sVar2 | ((short)uVar67 >= sVar2) * uVar67;
  auVar49._14_2_ = (ushort)((short)uVar69 < sVar3) * sVar3 | ((short)uVar69 >= sVar3) * uVar69;
  auVar44 = paddsw(auVar46,auVar45);
  auVar42 = paddsw(auVar49,auVar45);
  *(long *)(s + -(long)(p * 2)) = auVar42._8_8_;
  *(long *)(s + -lVar40) = auVar42._0_8_;
  *(long *)s = auVar44._0_8_;
  *(long *)(s + lVar40) = auVar44._8_8_;
  return;
}

Assistant:

void aom_highbd_lpf_horizontal_4_sse2(uint16_t *s, int p,
                                      const uint8_t *_blimit,
                                      const uint8_t *_limit,
                                      const uint8_t *_thresh, int bd) {
  __m128i p1p0, q1q0;
  __m128i p1 = _mm_loadl_epi64((__m128i *)(s - 2 * p));
  __m128i p0 = _mm_loadl_epi64((__m128i *)(s - 1 * p));
  __m128i q0 = _mm_loadl_epi64((__m128i *)(s - 0 * p));
  __m128i q1 = _mm_loadl_epi64((__m128i *)(s + 1 * p));

  highbd_lpf_internal_4_sse2(&p1, &p0, &q0, &q1, &q1q0, &p1p0, _blimit, _limit,
                             _thresh, bd);

  _mm_storel_epi64((__m128i *)(s - 2 * p), _mm_srli_si128(p1p0, 8));
  _mm_storel_epi64((__m128i *)(s - 1 * p), p1p0);
  _mm_storel_epi64((__m128i *)(s + 0 * p), q1q0);
  _mm_storel_epi64((__m128i *)(s + 1 * p), _mm_srli_si128(q1q0, 8));
}